

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcGraft.c
# Opt level: O2

Vec_Int_t * Wlc_NtkCollectObjs(Wlc_Ntk_t *p,int fEven,int *pCount)

{
  int iVar1;
  Vec_Int_t *vObjs;
  Wlc_Obj_t *pObj;
  int iVar2;
  uint i;
  
  vObjs = Vec_IntAlloc(100);
  Wlc_NtkCleanMarks(p);
  iVar2 = 0;
  for (i = 0; (int)i < (p->vCos).nSize; i = i + 1) {
    iVar1 = Vec_IntEntry(&p->vCos,i);
    pObj = Wlc_NtkObj(p,iVar1);
    if ((i & 1) == fEven) {
      iVar1 = Wlc_NtkCollectObjs_rec(p,pObj,vObjs);
      iVar2 = iVar2 + iVar1;
    }
  }
  Wlc_NtkCleanMarks(p);
  if (pCount != (int *)0x0) {
    *pCount = iVar2;
  }
  return vObjs;
}

Assistant:

Vec_Int_t * Wlc_NtkCollectObjs( Wlc_Ntk_t * p, int fEven, int * pCount )
{
    Vec_Int_t * vObjs = Vec_IntAlloc( 100 );
    Wlc_Obj_t * pObj; 
    int i, Count = 0;
    Wlc_NtkCleanMarks( p );
    Wlc_NtkForEachCo( p, pObj, i )
        if ( (i & 1) == fEven )
            Count += Wlc_NtkCollectObjs_rec( p, pObj, vObjs );
    Wlc_NtkCleanMarks( p );
    if ( pCount )
        *pCount = Count;
    return vObjs;
}